

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmSinglePixelSwapRgb.cpp
# Opt level: O0

void __thiscall AlgorithmSinglePixelSwapRgb::Iterate(AlgorithmSinglePixelSwapRgb *this)

{
  int iVar1;
  int iVar2;
  QRgb a_00;
  QRgb a_01;
  QRgb QVar3;
  int iVar4;
  int iVar5;
  int bSwappedDifference;
  int aSwappedDifference;
  int bDifference;
  int aDifference;
  QRgb b;
  QRgb a;
  QPoint bLoc;
  QPoint aLoc;
  int i;
  int repeats;
  AlgorithmSinglePixelSwapRgb *this_local;
  
  for (aLoc.xp = 0; aLoc.xp < 100000; aLoc.xp = aLoc.xp + 1) {
    iVar1 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    iVar2 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    QPoint::QPoint(&bLoc,iVar1,iVar2);
    iVar1 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    iVar2 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    QPoint::QPoint((QPoint *)&b,iVar1,iVar2);
    a_00 = QImage::pixel(&(this->super_AlgorithmBase).allRgb_,&bLoc);
    a_01 = QImage::pixel(&(this->super_AlgorithmBase).allRgb_,(QPoint *)&b);
    QVar3 = QImage::pixel(&(this->super_AlgorithmBase).target_,&bLoc);
    iVar1 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a_00,QVar3);
    QVar3 = QImage::pixel(&(this->super_AlgorithmBase).target_,(QPoint *)&b);
    iVar2 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a_01,QVar3);
    QVar3 = QImage::pixel(&(this->super_AlgorithmBase).target_,(QPoint *)&b);
    iVar4 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a_00,QVar3);
    QVar3 = QImage::pixel(&(this->super_AlgorithmBase).target_,&bLoc);
    iVar5 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a_01,QVar3);
    if (iVar4 + iVar5 < iVar1 + iVar2) {
      QImage::setPixel(&(this->super_AlgorithmBase).allRgb_,&bLoc,a_01);
      QImage::setPixel(&(this->super_AlgorithmBase).allRgb_,(QPoint *)&b,a_00);
      (this->super_AlgorithmBase).improvements_ = (this->super_AlgorithmBase).improvements_ + 1;
    }
  }
  (this->super_AlgorithmBase).iterations_ = (this->super_AlgorithmBase).iterations_ + 100000;
  AlgorithmBase::onIterationsChanged
            (&this->super_AlgorithmBase,(this->super_AlgorithmBase).iterations_);
  AlgorithmBase::onImprovementsChanged
            (&this->super_AlgorithmBase,(this->super_AlgorithmBase).improvements_);
  return;
}

Assistant:

void AlgorithmSinglePixelSwapRgb::Iterate()
{
    // Do a block of repeats in one go for efficiency
    const int repeats = 100000;
    for (int i = 0; i < repeats; ++i) {
        QPoint aLoc{ RandomNumber(0, 4096 - 1), RandomNumber(0, 4096 - 1) };
        QPoint bLoc{ RandomNumber(0, 4096 - 1), RandomNumber(0, 4096 - 1) };
        QRgb a = allRgb_.pixel(aLoc);
        QRgb b = allRgb_.pixel(bLoc);

        int aDifference = ColourDifference(a, target_.pixel(aLoc));
        int bDifference = ColourDifference(b, target_.pixel(bLoc));

        int aSwappedDifference = ColourDifference(a, target_.pixel(bLoc));
        int bSwappedDifference = ColourDifference(b, target_.pixel(aLoc));

        if ((aDifference + bDifference) > (aSwappedDifference + bSwappedDifference)) {
            allRgb_.setPixel(aLoc, b);
            allRgb_.setPixel(bLoc, a);
            ++improvements_;
        }
    }
    iterations_ += repeats;

    emit onIterationsChanged(iterations_);
    emit onImprovementsChanged(improvements_);
}